

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::EmitReturnExpr
          (WasmBytecodeGenerator *this,PolymorphicEmitInfo *explicitRetInfo)

{
  undefined8 uVar1;
  OpCodeAsmJs OVar2;
  uint32 i;
  uint32 index;
  PolymorphicEmitInfo PVar3;
  undefined1 auStack_48 [8];
  PolymorphicEmitInfo retExprInfo;
  EmitInfo info;
  
  if (explicitRetInfo == (PolymorphicEmitInfo *)0x0) {
    PVar3 = PopStackPolymorphic(this,this->m_funcBlock,(char16 *)0x0);
    retExprInfo._0_8_ = PVar3.field_1;
    uVar1._0_4_ = PVar3.count;
    auStack_48._0_4_ = (uint32)uVar1;
  }
  else {
    uVar1._0_4_ = explicitRetInfo->count;
    uVar1._4_4_ = *(undefined4 *)&explicitRetInfo->field_0x4;
    retExprInfo._0_8_ = explicitRetInfo->field_1;
    auStack_48 = (undefined1  [8])uVar1;
  }
  for (index = 0; index < (uint32)uVar1; index = index + 1) {
    retExprInfo.field_1.singleInfo =
         PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_48,index);
    OVar2 = GetReturnOp(this,retExprInfo.field_1.singleInfo.type);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[8])
              (this->m_writer,(ulong)OVar2,0,(ulong)retExprInfo.field_1.infos & 0xffffffff);
    ReleaseLocation(this,&retExprInfo.field_1.singleInfo);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)this->m_funcInfo->m_ExitLabel,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitReturnExpr(PolymorphicEmitInfo* explicitRetInfo)
{
    PolymorphicEmitInfo retExprInfo = explicitRetInfo ? *explicitRetInfo : PopStackPolymorphic(m_funcBlock);
    for (uint32 i = 0; i < retExprInfo.Count(); ++i)
    {
        EmitInfo info = retExprInfo.GetInfo(i);
        Js::OpCodeAsmJs retOp = GetReturnOp(info.type);
        m_writer->Conv(retOp, 0, info.location);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(m_funcInfo->GetExitLabel());

    SetUnreachableState(true);
}